

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O0

void Abc_NodeConeMarkCollect_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vVisited)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vVisited_local;
  Abc_Obj_t *pNode_local;
  
  if ((*(uint *)&pNode->field_0x14 >> 4 & 1) != 1) {
    iVar1 = Abc_ObjIsNode(pNode);
    if (iVar1 != 0) {
      pAVar2 = Abc_ObjFanin0(pNode);
      Abc_NodeConeMarkCollect_rec(pAVar2,vVisited);
      pAVar2 = Abc_ObjFanin1(pNode);
      Abc_NodeConeMarkCollect_rec(pAVar2,vVisited);
    }
    if ((*(uint *)&pNode->field_0x14 >> 4 & 1) != 0) {
      __assert_fail("pNode->fMarkA == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                    ,0x1e5,"void Abc_NodeConeMarkCollect_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    *(uint *)&pNode->field_0x14 = *(uint *)&pNode->field_0x14 & 0xffffffef | 0x10;
    Vec_PtrPush(vVisited,pNode);
  }
  return;
}

Assistant:

void Abc_NodeConeMarkCollect_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vVisited )
{
    if ( pNode->fMarkA == 1 )
        return;
    // visit transitive fanin 
    if ( Abc_ObjIsNode(pNode) )
    {
        Abc_NodeConeMarkCollect_rec( Abc_ObjFanin0(pNode), vVisited );
        Abc_NodeConeMarkCollect_rec( Abc_ObjFanin1(pNode), vVisited );
    }
    assert( pNode->fMarkA == 0 );
    pNode->fMarkA = 1;
    Vec_PtrPush( vVisited, pNode );
}